

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

void __thiscall btQuantizedBvh::buildInternal(btQuantizedBvh *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btQuantizedBvhNode *ptr;
  btBvhSubtreeInfo *pbVar3;
  btOptimizedBvhNode *ptr_00;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  int iVar8;
  btQuantizedBvhNode *pbVar9;
  btBvhSubtreeInfo *pbVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  this->m_useQuantization = true;
  iVar8 = (this->m_quantizedLeafNodes).m_size;
  iVar12 = iVar8 * 2;
  uVar7 = (this->m_quantizedContiguousNodes).m_size;
  if ((int)uVar7 < iVar12) {
    lVar13 = (long)(int)uVar7;
    if ((this->m_quantizedContiguousNodes).m_capacity < iVar12) {
      if (iVar8 == 0) {
        pbVar9 = (btQuantizedBvhNode *)0x0;
      }
      else {
        pbVar9 = (btQuantizedBvhNode *)btAlignedAllocInternal((long)iVar8 << 5,0x10);
        uVar7 = (this->m_quantizedContiguousNodes).m_size;
      }
      if (0 < (int)uVar7) {
        lVar11 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar11);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar9->m_quantizedAabbMin + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar11 = lVar11 + 0x10;
        } while ((ulong)uVar7 << 4 != lVar11);
      }
      ptr = (this->m_quantizedContiguousNodes).m_data;
      if ((ptr != (btQuantizedBvhNode *)0x0) &&
         ((this->m_quantizedContiguousNodes).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_quantizedContiguousNodes).m_ownsMemory = true;
      (this->m_quantizedContiguousNodes).m_data = pbVar9;
      (this->m_quantizedContiguousNodes).m_capacity = iVar12;
    }
    lVar11 = iVar12 - lVar13;
    lVar13 = lVar13 << 4;
    do {
      puVar1 = (undefined8 *)
               ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar13);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar13 = lVar13 + 0x10;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  (this->m_quantizedContiguousNodes).m_size = iVar12;
  this->m_curNodeIndex = 0;
  buildTree(this,0,iVar8);
  if ((this->m_useQuantization == true) && ((this->m_SubtreeHeaders).m_size == 0)) {
    iVar8 = 1;
    if ((this->m_SubtreeHeaders).m_capacity == 0) {
      pbVar10 = (btBvhSubtreeInfo *)btAlignedAllocInternal(0x20,0x10);
      lVar13 = (long)(this->m_SubtreeHeaders).m_size;
      if (0 < lVar13) {
        lVar11 = 0;
        do {
          pbVar3 = (this->m_SubtreeHeaders).m_data;
          puVar1 = (undefined8 *)((long)pbVar3->m_quantizedAabbMin + lVar11);
          uVar4 = *puVar1;
          uVar5 = puVar1[1];
          puVar1 = (undefined8 *)((long)pbVar3->m_padding + lVar11 + -4);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar10->m_padding + lVar11 + -4);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          puVar1 = (undefined8 *)((long)pbVar10->m_quantizedAabbMin + lVar11);
          *puVar1 = uVar4;
          puVar1[1] = uVar5;
          lVar11 = lVar11 + 0x20;
        } while (lVar13 * 0x20 != lVar11);
      }
      pbVar3 = (this->m_SubtreeHeaders).m_data;
      if ((pbVar3 != (btBvhSubtreeInfo *)0x0) && ((this->m_SubtreeHeaders).m_ownsMemory == true)) {
        btAlignedFreeInternal(pbVar3);
      }
      (this->m_SubtreeHeaders).m_ownsMemory = true;
      (this->m_SubtreeHeaders).m_data = pbVar10;
      (this->m_SubtreeHeaders).m_capacity = 1;
      iVar8 = (this->m_SubtreeHeaders).m_size + 1;
    }
    (this->m_SubtreeHeaders).m_size = iVar8;
    pbVar9 = (this->m_quantizedContiguousNodes).m_data;
    pbVar10 = (this->m_SubtreeHeaders).m_data;
    pbVar10->m_quantizedAabbMin[0] = pbVar9->m_quantizedAabbMin[0];
    pbVar10->m_quantizedAabbMin[1] = pbVar9->m_quantizedAabbMin[1];
    pbVar10->m_quantizedAabbMin[2] = pbVar9->m_quantizedAabbMin[2];
    pbVar10->m_quantizedAabbMax[0] = pbVar9->m_quantizedAabbMax[0];
    pbVar10->m_quantizedAabbMax[1] = pbVar9->m_quantizedAabbMax[1];
    pbVar10->m_quantizedAabbMax[2] = pbVar9->m_quantizedAabbMax[2];
    pbVar10->m_rootNodeIndex = 0;
    iVar8 = -pbVar9->m_escapeIndexOrTriangleIndex;
    if (-1 < pbVar9->m_escapeIndexOrTriangleIndex) {
      iVar8 = 1;
    }
    pbVar10->m_subtreeSize = iVar8;
  }
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  pbVar9 = (this->m_quantizedLeafNodes).m_data;
  if ((pbVar9 != (btQuantizedBvhNode *)0x0) && ((this->m_quantizedLeafNodes).m_ownsMemory == true))
  {
    btAlignedFreeInternal(pbVar9);
  }
  (this->m_quantizedLeafNodes).m_ownsMemory = true;
  (this->m_quantizedLeafNodes).m_data = (btQuantizedBvhNode *)0x0;
  (this->m_quantizedLeafNodes).m_size = 0;
  (this->m_quantizedLeafNodes).m_capacity = 0;
  ptr_00 = (this->m_leafNodes).m_data;
  if ((ptr_00 != (btOptimizedBvhNode *)0x0) && ((this->m_leafNodes).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr_00);
  }
  (this->m_leafNodes).m_ownsMemory = true;
  (this->m_leafNodes).m_data = (btOptimizedBvhNode *)0x0;
  (this->m_leafNodes).m_size = 0;
  (this->m_leafNodes).m_capacity = 0;
  return;
}

Assistant:

void btQuantizedBvh::buildInternal()
{
	///assumes that caller filled in the m_quantizedLeafNodes
	m_useQuantization = true;
	int numLeafNodes = 0;
	
	if (m_useQuantization)
	{
		//now we have an array of leafnodes in m_leafNodes
		numLeafNodes = m_quantizedLeafNodes.size();

		m_quantizedContiguousNodes.resize(2*numLeafNodes);

	}

	m_curNodeIndex = 0;

	buildTree(0,numLeafNodes);

	///if the entire tree is small then subtree size, we need to create a header info for the tree
	if(m_useQuantization && !m_SubtreeHeaders.size())
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(m_quantizedContiguousNodes[0]);
		subtree.m_rootNodeIndex = 0;
		subtree.m_subtreeSize = m_quantizedContiguousNodes[0].isLeafNode() ? 1 : m_quantizedContiguousNodes[0].getEscapeIndex();
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

	//PCK: clear m_quantizedLeafNodes and m_leafNodes, they are temporary
	m_quantizedLeafNodes.clear();
	m_leafNodes.clear();
}